

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O3

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::ReadInternal<false>
          (DeltaLengthByteArrayDecoder *this,shared_ptr<duckdb::ResizeableBuffer,_true> *block_ref,
          uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  uint64_t *puVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  data_ptr_t str_data;
  idx_t iVar4;
  type pRVar5;
  StringColumnReader *this_00;
  IOException *this_01;
  ulong uVar6;
  data_ptr_t __src;
  data_ptr_t pdVar7;
  string local_68;
  data_ptr_t local_48;
  shared_ptr<duckdb::ResizeableBuffer,_true> *local_40;
  Vector *local_38;
  
  local_40 = block_ref;
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(block_ref);
  pdVar3 = (this->length_buffer->super_ByteBuffer).ptr;
  local_48 = result->data;
  local_38 = result;
  FlatVector::VerifyFlatVector(result);
  if (this->length_idx + read_count <= this->byte_array_count) {
    str_data = (pRVar5->super_ByteBuffer).ptr;
    if (read_count != 0) {
      pdVar7 = local_48 + result_offset * 0x10 + 4;
      __src = str_data;
      do {
        iVar4 = this->length_idx;
        this->length_idx = iVar4 + 1;
        uVar2 = *(uint *)(pdVar3 + iVar4 * 4);
        if ((ulong)uVar2 < 0xd) {
          local_68._M_string_length._0_4_ = 0;
          local_68._M_dataplus._M_p._0_4_ = 0;
          local_68._M_dataplus._M_p._4_4_ = 0;
          if (uVar2 != 0) {
            switchD_015df945::default(&local_68,__src,(ulong)uVar2);
          }
        }
        else {
          local_68._M_dataplus._M_p._0_4_ = *(undefined4 *)__src;
          local_68._M_dataplus._M_p._4_4_ = SUB84(__src,0);
          local_68._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
        }
        *(uint *)(pdVar7 + -4) = uVar2;
        *(ulong *)pdVar7 = CONCAT44(local_68._M_dataplus._M_p._4_4_,local_68._M_dataplus._M_p._0_4_)
        ;
        *(undefined4 *)(pdVar7 + 8) = (undefined4)local_68._M_string_length;
        uVar6 = (ulong)*(uint *)(pdVar3 + iVar4 * 4);
        puVar1 = &(pRVar5->super_ByteBuffer).len;
        *puVar1 = *puVar1 - uVar6;
        __src = (pRVar5->super_ByteBuffer).ptr + uVar6;
        (pRVar5->super_ByteBuffer).ptr = __src;
        pdVar7 = pdVar7 + 0x10;
        read_count = read_count - 1;
      } while (read_count != 0);
    }
    this_00 = ColumnReader::Cast<duckdb::StringColumnReader>(this->reader);
    StringColumnReader::VerifyString
              (this_00,(char *)str_data,*(int *)&(pRVar5->super_ByteBuffer).ptr - (int)str_data);
    StringColumnReader::ReferenceBlock(local_38,local_40);
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
             ,"");
  IOException::IOException<unsigned_long,unsigned_long>
            (this_01,&local_68,read_count + this->length_idx,this->byte_array_count);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DeltaLengthByteArrayDecoder::ReadInternal(shared_ptr<ResizeableBuffer> &block_ref, uint8_t *const defines,
                                               const idx_t read_count, Vector &result, const idx_t result_offset) {
	auto &block = *block_ref;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);
	auto result_data = FlatVector::GetData<string_t>(result);
	auto &result_mask = FlatVector::Validity(result);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + read_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + read_count, byte_array_count);
		}
	}

	const auto start_ptr = block.ptr;
	for (idx_t row_idx = 0; row_idx < read_count; row_idx++) {
		const auto result_idx = result_offset + row_idx;
		if (HAS_DEFINES) {
			if (defines[result_idx] != reader.MaxDefine()) {
				result_mask.SetInvalid(result_idx);
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		const auto &str_len = length_data[length_idx++];
		result_data[result_idx] = string_t(char_ptr_cast(block.ptr), str_len);
		block.unsafe_inc(str_len);
	}

	// Verify that the strings we read are valid UTF-8
	reader.Cast<StringColumnReader>().VerifyString(char_ptr_cast(start_ptr), block.ptr - start_ptr);

	StringColumnReader::ReferenceBlock(result, block_ref);
}